

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O0

JsErrorCode
JsSetPropertyCommon(ScriptContext *scriptContext,JsValueRef object,PropertyRecord *propertyRecord,
                   JsValueRef value,bool useStrictRules)

{
  code *pcVar1;
  bool bVar2;
  PropertyId propertyId;
  ThreadContext *this;
  undefined4 *puVar3;
  bool useStrictRules_local;
  JsValueRef value_local;
  PropertyRecord *propertyRecord_local;
  JsValueRef object_local;
  ScriptContext *scriptContext_local;
  
  this = Js::ScriptContext::GetThreadContext(scriptContext);
  bVar2 = ThreadContext::IsScriptActive(this);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/Jsrt.cpp"
                       ,0x684,"(scriptContext->GetThreadContext()->IsScriptActive())",
                       "Caller is expected to be under ContextAPIWrapper!");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  propertyId = Js::PropertyRecord::GetPropertyId(propertyRecord);
  Js::JavascriptOperators::OP_SetProperty
            (object,propertyId,value,scriptContext,(PropertyValueInfo *)0x0,(uint)useStrictRules,
             (Var)0x0);
  return JsNoError;
}

Assistant:

static JsErrorCode JsSetPropertyCommon(Js::ScriptContext * scriptContext, _In_ JsValueRef object,
    _In_ const Js::PropertyRecord * propertyRecord, _In_ JsValueRef value, _In_ bool useStrictRules)
{
    AssertMsg(scriptContext->GetThreadContext()->IsScriptActive(), "Caller is expected to be under ContextAPIWrapper!");

    Js::JavascriptOperators::OP_SetProperty(object, propertyRecord->GetPropertyId(),
        value, scriptContext, nullptr, useStrictRules ? Js::PropertyOperation_StrictMode : Js::PropertyOperation_None);

    return JsNoError;
}